

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gssc.c
# Opt level: O0

Ssh_gss_stat ssh_gssapi_import_name(ssh_gss_library *lib,char *host,Ssh_gss_name *srv_name)

{
  char *__s;
  char *pStr;
  gss_buffer_desc host_buf;
  OM_uint32 maj_stat;
  OM_uint32 min_stat;
  gssapi_functions *gss;
  Ssh_gss_name *srv_name_local;
  char *host_local;
  ssh_gss_library *lib_local;
  
  __s = dupcat_fn("host@",host,0);
  host_buf.length = (size_t)__s;
  pStr = (char *)strlen(__s);
  host_buf.value._0_4_ =
       (*(lib->u).gssapi.import_name)
                 ((OM_uint32 *)((long)&host_buf.value + 4),(gss_buffer_t)&pStr,
                  GSS_C_NT_HOSTBASED_SERVICE,srv_name);
  safefree(__s);
  if ((OM_uint32)host_buf.value == 0) {
    lib_local._4_4_ = SSH_GSS_OK;
  }
  else {
    lib_local._4_4_ = SSH_GSS_FAILURE;
  }
  return lib_local._4_4_;
}

Assistant:

static Ssh_gss_stat ssh_gssapi_import_name(struct ssh_gss_library *lib,
                                           char *host,
                                           Ssh_gss_name *srv_name)
{
    struct gssapi_functions *gss = &lib->u.gssapi;
    OM_uint32 min_stat,maj_stat;
    gss_buffer_desc host_buf;
    char *pStr;

    pStr = dupcat("host@", host);

    host_buf.value = pStr;
    host_buf.length = strlen(pStr);

    maj_stat = gss->import_name(&min_stat, &host_buf,
                                GSS_C_NT_HOSTBASED_SERVICE, srv_name);
    /* Release buffer */
    sfree(pStr);
    if (maj_stat == GSS_S_COMPLETE) return SSH_GSS_OK;
    return SSH_GSS_FAILURE;
}